

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error.c
# Opt level: O3

void ma_error(ErrorLevel elevel,ErrorType etype,char *func,char *emsg)

{
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  bool bVar4;
  
  if (((elevel == EL_Fatal) || (ma_hard_fail != 0)) || (ma_error_print != 0)) {
    pcVar2 = "";
    if (etype == ET_Internal) {
      pcVar2 = "internal ";
    }
    pcVar1 = "hard failure";
    if (ma_hard_fail == 0) {
      pcVar1 = "error";
    }
    pcVar3 = "fatal error";
    if (elevel != EL_Fatal) {
      pcVar3 = pcVar1;
    }
    fflush(_stdout);
    fflush(_stderr);
    fprintf(_stderr,"MA %s%s: %s: %s\n",pcVar2,pcVar3,func,emsg);
    fflush(_stderr);
    bVar4 = ma_hard_fail != 0;
  }
  else {
    bVar4 = false;
  }
  if ((elevel != EL_Fatal) && (!bVar4)) {
    return;
  }
  if (ma_func_terminate != (_func_void_char_ptr_int *)0x0) {
    (*ma_func_terminate)("MA aborting",0);
    return;
  }
  exit(1);
}

Assistant:

public void ma_error(ErrorLevel elevel, ErrorType etype, char *func, char *emsg)
{
    /* print a message? */
    if ((elevel == EL_Fatal) || ma_hard_fail || ma_error_print)
    {
        char *s1; /* internal or not */
        char *s2; /* class of error */

        /* set s1 */
        if (etype == ET_Internal) {
            s1 = "internal ";
        } else {
            s1 = "";
        }

        /* set s2 */
        if (elevel == EL_Fatal) {
            s2 = "fatal error";
        } else if (ma_hard_fail) {
            s2 = "hard failure";
        } else {
            s2 = "error";
        }

        /* print the message */
        (void)fflush(stdout);
        (void)fflush(stderr);
        (void)fprintf(stderr, "MA %s%s: %s: %s\n", s1, s2, func, emsg);
        (void)fflush(stderr);
    }

    /* terminate execution? */
    if ((elevel == EL_Fatal) || ma_hard_fail) {
        if(ma_func_terminate) {
            ma_func_terminate("MA aborting",0);
        } else {
            exit(1);
        }
    }
}